

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O2

float add(float value)

{
  float scanValue;
  float local_c;
  
  local_c = 0.0;
  printf("%.2f + ",(double)value);
  __isoc99_scanf("%f",&local_c);
  return value + local_c;
}

Assistant:

float add(float value) {
    float scanValue = 0;
    printf("%.2f + ", value);
    /* Asks for the value to add */
    scanf("%f", &scanValue);
    /* Adds the value and returns it. */
    return value + scanValue;
}